

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O3

int32_t ecs_pipeline_begin(ecs_world_t *world,ecs_entity_t pipeline)

{
  int32_t iVar1;
  EcsPipelineQuery *pq;
  
  _ecs_assert((_Bool)(world->in_progress ^ 1),0xc,(char *)0x0,"!world->in_progress",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/pipeline/pipeline.c"
              ,0x13f);
  if (world->in_progress == true) {
    __assert_fail("!world->in_progress",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/pipeline/pipeline.c"
                  ,0x13f,"int32_t ecs_pipeline_begin(ecs_world_t *, ecs_entity_t)");
  }
  ecs_eval_component_monitors(world);
  pq = (EcsPipelineQuery *)ecs_get_mut_w_entity(world,pipeline,0xd,(_Bool *)0x0);
  _ecs_assert(pq != (EcsPipelineQuery *)0x0,0xc,(char *)0x0,"pq != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/pipeline/pipeline.c"
              ,0x145);
  if (pq != (EcsPipelineQuery *)0x0) {
    _ecs_assert(pq->query != (ecs_query_t *)0x0,0xc,(char *)0x0,"pq->query != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/pipeline/pipeline.c"
                ,0x146);
    if (pq->query != (ecs_query_t *)0x0) {
      build_pipeline(world,pipeline,pq);
      iVar1 = ecs_vector_count(pq->ops);
      return iVar1;
    }
    __assert_fail("pq->query != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/pipeline/pipeline.c"
                  ,0x146,"int32_t ecs_pipeline_begin(ecs_world_t *, ecs_entity_t)");
  }
  __assert_fail("pq != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/modules/pipeline/pipeline.c"
                ,0x145,"int32_t ecs_pipeline_begin(ecs_world_t *, ecs_entity_t)");
}

Assistant:

int32_t ecs_pipeline_begin(
    ecs_world_t *world,
    ecs_entity_t pipeline)
{
    ecs_assert(!world->in_progress, ECS_INTERNAL_ERROR, NULL);

    ecs_eval_component_monitors(world);

    EcsPipelineQuery *pq = ecs_get_mut(
        world, pipeline, EcsPipelineQuery, NULL);
    ecs_assert(pq != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(pq->query != NULL, ECS_INTERNAL_ERROR, NULL);

    build_pipeline(world, pipeline, pq);

    return ecs_vector_count(pq->ops);
}